

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.h
# Opt level: O0

void __thiscall mjs::token::token(token *this,token_type type,wstring *text)

{
  bool bVar1;
  wstring *text_local;
  token_type type_local;
  token *this_local;
  
  this->type_ = type;
  std::__cxx11::wstring::wstring((wstring *)&(this->field_1).text_,(wstring *)text);
  bVar1 = has_text(this);
  if (!bVar1) {
    __assert_fail("has_text()",
                  "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/lexer.h",
                  0xac,"mjs::token::token(token_type, const std::wstring &)");
  }
  return;
}

Assistant:

explicit token(token_type type, const std::wstring& text) : type_(type), text_(text) {
        assert(has_text());
    }